

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall ON_Layer::Dump(ON_Layer *this,ON_TextLog *dump)

{
  bool bVar1;
  ON_SectionStyle *pOVar2;
  char *pcVar3;
  ON_SectionStyle *section_style;
  ON_TextLog *dump_local;
  ON_Layer *this_local;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  bVar1 = IsVisible(this);
  pcVar3 = "hidden";
  if (bVar1) {
    pcVar3 = "visible";
  }
  ON_TextLog::Print(dump,"display = %s\n",pcVar3);
  bVar1 = ON_ModelComponent::IsLocked(&this->super_ON_ModelComponent);
  pcVar3 = "unlocked";
  if (bVar1) {
    pcVar3 = "locked";
  }
  ON_TextLog::Print(dump,"picking = %s\n",pcVar3);
  ON_TextLog::Print(dump,"display color rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_color);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"plot color rgb = ");
  ON_TextLog::PrintRGB(dump,&this->m_plot_color);
  ON_TextLog::Print(dump,"\n");
  ON_TextLog::Print(dump,"default material index = %d\n",(ulong)(uint)this->m_material_index);
  pOVar2 = CustomSectionStyle(this,(ON_SectionStyle *)0x0);
  if (pOVar2 == (ON_SectionStyle *)0x0) {
    ON_TextLog::Print(dump,"No custom section style\n");
  }
  else {
    ON_TextLog::Print(dump,"Has custom section style\n");
  }
  return;
}

Assistant:

void ON_Layer::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);
  dump.Print("display = %s\n",IsVisible()?"visible":"hidden");
  dump.Print("picking = %s\n",IsLocked()?"locked":"unlocked");
  dump.Print("display color rgb = "); dump.PrintRGB(m_color); dump.Print("\n");
  dump.Print("plot color rgb = "); dump.PrintRGB(m_plot_color); dump.Print("\n");
  dump.Print("default material index = %d\n",m_material_index);

  //{
  //  bool clipAll = true;
  //  bool clipNone = false;
  //  ON_UuidList cliplist;
  //  bool isSelectiveList = true;
  //  GetClipParticipation(clipAll, clipNone, cliplist, isSelectiveList);
  //  if (clipAll)
  //  {
  //    dump.Print("participates with all clipping planes\n");
  //  }
  //  else if (clipNone)
  //  {
  //    dump.Print("participates with no clipping planes\n");
  //  }
  //  else
  //  {
  //    dump.Print("participates with specific clipping planes\n");
  //  }
  //}

  const ON_SectionStyle* section_style = CustomSectionStyle();
  if (nullptr == section_style)
  {
    dump.Print("No custom section style\n");
  }
  else
  {
    dump.Print("Has custom section style\n");
  }
}